

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O0

int ON_CompareDoubleArray(size_t count,double *a,double *b)

{
  double *b_local;
  double *a_local;
  size_t count_local;
  
  if (count == 0) {
    count_local._4_4_ = 0;
  }
  else if (a == b) {
    count_local._4_4_ = 0;
  }
  else if (a == (double *)0x0) {
    count_local._4_4_ = 1;
  }
  else if (b == (double *)0x0) {
    count_local._4_4_ = -1;
  }
  else {
    count_local._4_4_ = Internal_DoubleArrayCompare(count,a,b);
  }
  return count_local._4_4_;
}

Assistant:

int ON_CompareDoubleArray(
  size_t count,
  const double* a,
  const double* b
  )
{
  if (count <= 0)
    return 0;
  if (a == b)
    return 0;
  if (nullptr == a)
    return 1;
  if (nullptr == b)
    return -1;
  return Internal_DoubleArrayCompare(count, a, b);
}